

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datefmt.cpp
# Opt level: O3

DateFormat * __thiscall icu_63::DateFormat::operator=(DateFormat *this,DateFormat *other)

{
  UDisplayContext UVar1;
  int iVar2;
  undefined4 extraout_var;
  NumberFormat *pNVar4;
  Calendar *pCVar3;
  undefined4 extraout_var_00;
  
  if (this != other) {
    if (this->fCalendar != (Calendar *)0x0) {
      (*(this->fCalendar->super_UObject)._vptr_UObject[1])();
    }
    if (this->fNumberFormat != (NumberFormat *)0x0) {
      (*(this->fNumberFormat->super_Format).super_UObject._vptr_UObject[1])();
    }
    if (other->fCalendar == (Calendar *)0x0) {
      pCVar3 = (Calendar *)0x0;
    }
    else {
      iVar2 = (*(other->fCalendar->super_UObject)._vptr_UObject[3])();
      pCVar3 = (Calendar *)CONCAT44(extraout_var,iVar2);
    }
    this->fCalendar = pCVar3;
    if (other->fNumberFormat == (NumberFormat *)0x0) {
      pNVar4 = (NumberFormat *)0x0;
    }
    else {
      iVar2 = (*(other->fNumberFormat->super_Format).super_UObject._vptr_UObject[4])();
      pNVar4 = (NumberFormat *)CONCAT44(extraout_var_00,iVar2);
    }
    this->fNumberFormat = pNVar4;
    UVar1 = other->fCapitalizationContext;
    this->fBoolFlags = (EnumSet<UDateFormatBooleanAttribute,_0U,_4U>)(other->fBoolFlags).fBools;
    this->fCapitalizationContext = UVar1;
  }
  return this;
}

Assistant:

DateFormat& DateFormat::operator=(const DateFormat& other)
{
    if (this != &other)
    {
        delete fCalendar;
        delete fNumberFormat;
        if(other.fCalendar) {
          fCalendar = other.fCalendar->clone();
        } else {
          fCalendar = NULL;
        }
        if(other.fNumberFormat) {
          fNumberFormat = (NumberFormat*)other.fNumberFormat->clone();
        } else {
          fNumberFormat = NULL;
        }
        fBoolFlags = other.fBoolFlags;
        fCapitalizationContext = other.fCapitalizationContext;
    }
    return *this;
}